

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border_offset.cpp
# Opt level: O0

size_t cppurses::detail::Border_offset::north(Widget *w)

{
  bool bVar1;
  Segments *b;
  Widget *w_local;
  
  bVar1 = Border::enabled(&w->border);
  if (((!bVar1) || (bVar1 = north_disqualified(w), bVar1)) ||
     ((bVar1 = Border::Segment::enabled((Segment *)&w->border), !bVar1 &&
      ((bVar1 = Border::Segment::enabled(&(w->border).segments.north_east), !bVar1 &&
       (bVar1 = Border::Segment::enabled(&(w->border).segments.north_west), !bVar1)))))) {
    w_local = (Widget *)0x0;
  }
  else {
    w_local = (Widget *)0x1;
  }
  return (size_t)w_local;
}

Assistant:

std::size_t Border_offset::north(const Widget& w) {
    const auto& b = w.border.segments;
    if (w.border.enabled() && !north_disqualified(w) &&
        (b.north.enabled() || b.north_east.enabled() ||
         b.north_west.enabled())) {
        return 1;
    }
    return 0;
}